

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorPool::Tables::RollbackToLastCheckpoint(Tables *this)

{
  bool bVar1;
  LogMessage *other;
  ulong uVar2;
  size_type sVar3;
  reference ppcVar4;
  reference __x;
  iterator end;
  reference ppvVar5;
  int local_c4;
  int i_3;
  __normal_iterator<google::protobuf::FileDescriptorTables_**,_std::vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>_>
  local_b8;
  __normal_iterator<google::protobuf::FileDescriptorTables_**,_std::vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>_>
  local_b0;
  Message **local_a8;
  __normal_iterator<google::protobuf::Message_**,_std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
  local_a0;
  __normal_iterator<google::protobuf::Message_**,_std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_90;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_**,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  local_88;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_**,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  local_80;
  int local_74;
  int local_70;
  int i_2;
  int i_1;
  int i;
  CheckPoint *checkpoint;
  byte local_49;
  LogMessage local_48;
  Tables *local_10;
  Tables *this_local;
  
  local_10 = this;
  bVar1 = std::
          vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
          ::empty(&this->checkpoints_);
  local_49 = 0;
  if (bVar1) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x250);
    local_49 = 1;
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: !checkpoints_.empty(): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&checkpoint + 3),other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  _i_1 = std::
         vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
         ::back(&this->checkpoints_);
  for (i_2 = _i_1->pending_symbols_before_checkpoint; uVar2 = (ulong)i_2,
      sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        (&this->symbols_after_checkpoint_), uVar2 < sVar3; i_2 = i_2 + 1) {
    ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&this->symbols_after_checkpoint_,(long)i_2);
    std::tr1::
    _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
    ::erase((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
             *)&this->symbols_by_name_,ppcVar4);
  }
  for (local_70 = _i_1->pending_files_before_checkpoint; uVar2 = (ulong)local_70,
      sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        (&this->files_after_checkpoint_), uVar2 < sVar3; local_70 = local_70 + 1) {
    ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&this->files_after_checkpoint_,(long)local_70);
    std::tr1::
    _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
    ::erase((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
             *)&this->files_by_name_,ppcVar4);
  }
  for (local_74 = _i_1->pending_extensions_before_checkpoint; uVar2 = (ulong)local_74,
      sVar3 = std::
              vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
              ::size(&this->extensions_after_checkpoint_), uVar2 < sVar3; local_74 = local_74 + 1) {
    __x = std::
          vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
          ::operator[](&this->extensions_after_checkpoint_,(long)local_74);
    std::
    map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
    ::erase(&this->extensions_,__x);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&this->symbols_after_checkpoint_,(long)_i_1->pending_symbols_before_checkpoint);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&this->files_after_checkpoint_,(long)_i_1->pending_files_before_checkpoint);
  std::
  vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ::resize(&this->extensions_after_checkpoint_,(long)_i_1->pending_extensions_before_checkpoint);
  local_88._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
       ::begin(&this->strings_);
  local_80 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_**,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
             ::operator+(&local_88,(long)_i_1->strings_before_checkpoint);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
             ::end(&this->strings_);
  STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<std::__cxx11::string**,std::vector<std::__cxx11::string*,std::allocator<std::__cxx11::string*>>>>
            (local_80,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_**,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                       )local_90);
  local_a0._M_current =
       (Message **)
       std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::begin
                 (&this->messages_);
  local_98 = __gnu_cxx::
             __normal_iterator<google::protobuf::Message_**,_std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
             ::operator+(&local_a0,(long)_i_1->messages_before_checkpoint);
  local_a8 = (Message **)
             std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>
             ::end(&this->messages_);
  STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::Message**,std::vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>>>
            (local_98,(__normal_iterator<google::protobuf::Message_**,_std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
                       )local_a8);
  local_b8._M_current =
       (FileDescriptorTables **)
       std::
       vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
       ::begin(&this->file_tables_);
  local_b0 = __gnu_cxx::
             __normal_iterator<google::protobuf::FileDescriptorTables_**,_std::vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>_>
             ::operator+(&local_b8,(long)_i_1->file_tables_before_checkpoint);
  end = std::
        vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
        ::end(&this->file_tables_);
  STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptorTables**,std::vector<google::protobuf::FileDescriptorTables*,std::allocator<google::protobuf::FileDescriptorTables*>>>>
            (local_b0,(__normal_iterator<google::protobuf::FileDescriptorTables_**,_std::vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>_>
                       )end._M_current);
  for (local_c4 = _i_1->allocations_before_checkpoint;
      sVar3 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->allocations_),
      (ulong)(long)local_c4 < sVar3; local_c4 = local_c4 + 1) {
    ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->allocations_,(long)local_c4);
    operator_delete(*ppvVar5);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::resize(&this->strings_,(long)_i_1->strings_before_checkpoint);
  std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::resize
            (&this->messages_,(long)_i_1->messages_before_checkpoint);
  std::
  vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
  ::resize(&this->file_tables_,(long)_i_1->file_tables_before_checkpoint);
  std::vector<void_*,_std::allocator<void_*>_>::resize
            (&this->allocations_,(long)_i_1->allocations_before_checkpoint);
  std::
  vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ::pop_back(&this->checkpoints_);
  return;
}

Assistant:

void DescriptorPool::Tables::RollbackToLastCheckpoint() {
  GOOGLE_DCHECK(!checkpoints_.empty());
  const CheckPoint& checkpoint = checkpoints_.back();

  for (int i = checkpoint.pending_symbols_before_checkpoint;
       i < symbols_after_checkpoint_.size();
       i++) {
    symbols_by_name_.erase(symbols_after_checkpoint_[i]);
  }
  for (int i = checkpoint.pending_files_before_checkpoint;
       i < files_after_checkpoint_.size();
       i++) {
    files_by_name_.erase(files_after_checkpoint_[i]);
  }
  for (int i = checkpoint.pending_extensions_before_checkpoint;
       i < extensions_after_checkpoint_.size();
       i++) {
    extensions_.erase(extensions_after_checkpoint_[i]);
  }

  symbols_after_checkpoint_.resize(
      checkpoint.pending_symbols_before_checkpoint);
  files_after_checkpoint_.resize(checkpoint.pending_files_before_checkpoint);
  extensions_after_checkpoint_.resize(
      checkpoint.pending_extensions_before_checkpoint);

  STLDeleteContainerPointers(
      strings_.begin() + checkpoint.strings_before_checkpoint, strings_.end());
  STLDeleteContainerPointers(
      messages_.begin() + checkpoint.messages_before_checkpoint,
      messages_.end());
  STLDeleteContainerPointers(
      file_tables_.begin() + checkpoint.file_tables_before_checkpoint,
      file_tables_.end());
  for (int i = checkpoint.allocations_before_checkpoint;
       i < allocations_.size();
       i++) {
    operator delete(allocations_[i]);
  }

  strings_.resize(checkpoint.strings_before_checkpoint);
  messages_.resize(checkpoint.messages_before_checkpoint);
  file_tables_.resize(checkpoint.file_tables_before_checkpoint);
  allocations_.resize(checkpoint.allocations_before_checkpoint);
  checkpoints_.pop_back();
}